

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall CDirectiveIncbin::CDirectiveIncbin(CDirectiveIncbin *this,path *fileName)

{
  bool bVar1;
  uintmax_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined1 local_78 [8];
  error_code error;
  path local_38;
  path *local_18;
  path *fileName_local;
  CDirectiveIncbin *this_local;
  
  local_18 = fileName;
  fileName_local = (path *)this;
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveIncbin_002aa0b8;
  ghc::filesystem::path::path(&this->fileName);
  Expression::Expression(&this->startExpression);
  Expression::Expression(&this->sizeExpression);
  this->size = 0;
  this->start = 0;
  getFullPathName(&local_38,local_18);
  ghc::filesystem::path::operator=(&this->fileName,&local_38);
  ghc::filesystem::path::~path(&local_38);
  bVar1 = ghc::filesystem::exists(&this->fileName);
  if (!bVar1) {
    ghc::filesystem::path::u8string_abi_cxx11_((string *)&error._M_cat,&this->fileName);
    Logger::printError<std::__cxx11::string>((Logger *)0x2,0x229475,(char *)&error._M_cat,in_RCX);
    std::__cxx11::string::~string((string *)&error._M_cat);
  }
  std::error_code::error_code((error_code *)local_78);
  uVar2 = ghc::filesystem::file_size(&this->fileName,(error_code *)local_78);
  this->fileSize = uVar2;
  return;
}

Assistant:

CDirectiveIncbin::CDirectiveIncbin(const fs::path& fileName)
	: size(0), start(0)
{
	this->fileName = getFullPathName(fileName);

	if (!fs::exists(this->fileName))
	{
		Logger::printError(Logger::FatalError, "File %s not found",this->fileName.u8string());
	}

	std::error_code error;
	this->fileSize = static_cast<int64_t>(fs::file_size(this->fileName, error));
}